

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O2

void Json_ReadTest(char *pFileName)

{
  void *__ptr;
  Vec_Wec_t *vObjs;
  Vec_Int_t *__ptr_00;
  long lVar1;
  long lVar2;
  Abc_Nam_t *pStrs;
  
  vObjs = Json_Read(pFileName,&pStrs);
  if (vObjs != (Vec_Wec_t *)0x0) {
    Json_Write("test.json",pStrs,vObjs);
    Abc_NamDeref(pStrs);
    __ptr_00 = vObjs->pArray;
    lVar1 = 8;
    for (lVar2 = 0; lVar2 < vObjs->nCap; lVar2 = lVar2 + 1) {
      __ptr = *(void **)((long)&__ptr_00->nCap + lVar1);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        __ptr_00 = vObjs->pArray;
        *(undefined8 *)((long)&__ptr_00->nCap + lVar1) = 0;
      }
      lVar1 = lVar1 + 0x10;
    }
    free(__ptr_00);
    free(vObjs);
    return;
  }
  return;
}

Assistant:

void Json_ReadTest( char * pFileName )
{
    Abc_Nam_t * pStrs;
    Vec_Wec_t * vObjs;
    vObjs = Json_Read( pFileName, &pStrs );
    if ( vObjs == NULL )
        return;
    Json_Write( "test.json", pStrs, vObjs );
    Abc_NamDeref( pStrs );
    Vec_WecFree( vObjs );
}